

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample02.cpp
# Opt level: O0

long __thiscall Dog::go_abi_cxx11_(Dog *this)

{
  int in_EDX;
  int local_24;
  int i;
  int n_times_local;
  Dog *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    std::__cxx11::string::operator+=((string *)this,anon_var_dwarf_1e3a8);
  }
  return (long)this;
}

Assistant:

std::string go(int n_times) override {
		std::string result;
		for (int i = 0; i < n_times; i++) {
			result += u8"ワン! ";
		}
		return result;
	}